

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockCheckedActualCall_multipleSameFunctionsExpectingAndHappenGradually_Test::
TEST_MockCheckedActualCall_multipleSameFunctionsExpectingAndHappenGradually_Test
          (TEST_MockCheckedActualCall_multipleSameFunctionsExpectingAndHappenGradually_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list = (MockExpectedCallsList *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter = (MockFailureReporter *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).emptyList =
       (MockExpectedCallsList *)0x0;
  TEST_GROUP_CppUTestGroupMockCheckedActualCall::TEST_GROUP_CppUTestGroupMockCheckedActualCall
            (&this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall);
  (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002ba0c0;
  return;
}

Assistant:

TEST(MockCheckedActualCall, multipleSameFunctionsExpectingAndHappenGradually)
{
    MockCheckedExpectedCall* call1 = new MockCheckedExpectedCall();
    MockCheckedExpectedCall* call2 = new MockCheckedExpectedCall();
    call1->withName("func");
    call2->withName("func");
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);

    LONGS_EQUAL(2, list->amountOfUnfulfilledExpectations());

    MockCheckedActualCall actualCall1(1, reporter, *list);
    actualCall1.withName("func");
    actualCall1.checkExpectations();

    LONGS_EQUAL(1, list->amountOfUnfulfilledExpectations());

    MockCheckedActualCall actualCall2(2, reporter, *list);
    actualCall2.withName("func");
    actualCall2.checkExpectations();

    LONGS_EQUAL(0, list->amountOfUnfulfilledExpectations());

    list->deleteAllExpectationsAndClearList();
}